

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

string * list_builtin_chat_templates_abi_cxx11_(void)

{
  pointer ppcVar1;
  int iVar2;
  size_t sVar3;
  string *psVar4;
  string *extraout_RAX;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *pcVar5;
  char **tmpl;
  pointer ppcVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> supported_tmpl;
  ostringstream msg;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = llama_chat_builtin_templates(0,0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_1c8,(long)iVar2);
  llama_chat_builtin_templates
            (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ppcVar1 = local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar6 = local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pcVar5 = *ppcVar6;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)&local_1c8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x20);
      }
      else {
        sVar3 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar3);
      }
      pcVar5 = ", ";
      if (ppcVar6 ==
          local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        pcVar5 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar5,
                 (ulong)((uint)(ppcVar6 !=
                               local_1c8.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -1) * 2));
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static std::string list_builtin_chat_templates() {
    std::vector<const char *> supported_tmpl;
    int32_t res = llama_chat_builtin_templates(nullptr, 0);
    supported_tmpl.resize(res);
    res = llama_chat_builtin_templates(supported_tmpl.data(), supported_tmpl.size());
    std::ostringstream msg;
    for (auto & tmpl : supported_tmpl) {
        msg << tmpl << (&tmpl == &supported_tmpl.back() ? "" : ", ");
    }
    return msg.str();
}